

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O1

string * __thiscall
ADSBExchangeConnection::GetStatusText_abi_cxx11_
          (string *__return_storage_ptr__,ADSBExchangeConnection *this)

{
  bool bVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  char *__format;
  uint uVar6;
  ulong uVar7;
  float fVar8;
  string __str;
  char t [25];
  long *local_78 [2];
  long local_68 [2];
  char local_58 [40];
  
  LTChannel::GetStatusText_abi_cxx11_(__return_storage_ptr__,(LTChannel *)this);
  iVar4 = (*(this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.super_LTChannel.
            _vptr_LTChannel[6])(this);
  if ((char)iVar4 != '\0') {
    iVar4 = (*(this->super_ADSBBase).super_LTFlightDataChannel.super_LTOnlineChannel.super_LTChannel
              ._vptr_LTChannel[10])(this);
    if (((byte)iVar4 & 0 < dataRefs.ADSBExRLimit) == 1) {
      local_58[0x10] = 0;
      local_58[0x11] = '\0';
      local_58[0x12] = '\0';
      local_58[0x13] = '\0';
      local_58[0x14] = '\0';
      local_58[0x15] = '\0';
      local_58[0x16] = '\0';
      local_58[0x17] = '\0';
      local_58[0x18] = '\0';
      local_58[0] = '\0';
      local_58[1] = '\0';
      local_58[2] = '\0';
      local_58[3] = '\0';
      local_58[4] = '\0';
      local_58[5] = '\0';
      local_58[6] = '\0';
      local_58[7] = '\0';
      local_58[8] = 0;
      local_58[9] = '\0';
      local_58[10] = '\0';
      local_58[0xb] = '\0';
      local_58[0xc] = '\0';
      local_58[0xd] = '\0';
      local_58[0xe] = '\0';
      local_58[0xf] = '\0';
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar7 = -dataRefs.ADSBExRRemain;
      if (0 < dataRefs.ADSBExRRemain) {
        uVar7 = dataRefs.ADSBExRRemain;
      }
      uVar6 = 1;
      if (9 < uVar7) {
        uVar5 = uVar7;
        uVar3 = 4;
        do {
          uVar6 = uVar3;
          if (uVar5 < 100) {
            uVar6 = uVar6 - 2;
            goto LAB_00148410;
          }
          if (uVar5 < 1000) {
            uVar6 = uVar6 - 1;
            goto LAB_00148410;
          }
          if (uVar5 < 10000) goto LAB_00148410;
          bVar1 = 99999 < uVar5;
          uVar5 = uVar5 / 10000;
          uVar3 = uVar6 + 4;
        } while (bVar1);
        uVar6 = uVar6 + 1;
      }
LAB_00148410:
      lVar2 = dataRefs.ADSBExRRemain >> 0x3f;
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct
                ((ulong)local_78,(char)uVar6 - (char)(dataRefs.ADSBExRRemain >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)((long)local_78[0] - lVar2),uVar6,uVar7);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78[0]);
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar7 = -dataRefs.ADSBExRLimit;
      if (0 < dataRefs.ADSBExRLimit) {
        uVar7 = dataRefs.ADSBExRLimit;
      }
      uVar6 = 1;
      if (9 < uVar7) {
        uVar5 = uVar7;
        uVar3 = 4;
        do {
          uVar6 = uVar3;
          if (uVar5 < 100) {
            uVar6 = uVar6 - 2;
            goto LAB_001484e7;
          }
          if (uVar5 < 1000) {
            uVar6 = uVar6 - 1;
            goto LAB_001484e7;
          }
          if (uVar5 < 10000) goto LAB_001484e7;
          bVar1 = 99999 < uVar5;
          uVar5 = uVar5 / 10000;
          uVar3 = uVar6 + 4;
        } while (bVar1);
        uVar6 = uVar6 + 1;
      }
LAB_001484e7:
      lVar2 = dataRefs.ADSBExRLimit >> 0x3f;
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct
                ((ulong)local_78,(char)uVar6 - (char)(dataRefs.ADSBExRLimit >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)((long)local_78[0] - lVar2),uVar6,uVar7);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78[0]);
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      if (dataRefs.ADSBExRReset < 0x2a301) {
        if (dataRefs.ADSBExRReset < 0x1c21) {
          fVar8 = (float)dataRefs.ADSBExRReset / 60.0;
          __format = "%.1f minutes";
        }
        else {
          fVar8 = (float)dataRefs.ADSBExRReset / 3600.0;
          __format = "%.1f hours";
        }
      }
      else {
        fVar8 = (float)dataRefs.ADSBExRReset / 86400.0;
        __format = "%.1f days";
      }
      snprintf(local_58,0x19,__format,SUB84((double)fVar8,0));
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ADSBExchangeConnection::GetStatusText () const
{
    std::string s = LTChannel::GetStatusText();
    if (IsValid() && IsEnabled() && dataRefs.ADSBExRLimit > 0)
    {
        char t[25] = "";
        s += " | ";
        s += std::to_string(dataRefs.ADSBExRRemain);
        s += " of ";
        s += std::to_string(dataRefs.ADSBExRLimit);
        s += " RAPID API requests left, resets in ";
        if (dataRefs.ADSBExRReset > 48*60*60)           // more than 2 days
            snprintf(t, sizeof(t), "%.1f days",
                    float(dataRefs.ADSBExRReset) / (24.0f*60.0f*60.0f));
        else if (dataRefs.ADSBExRReset >  2*60*60)      // more than 2 hours
            snprintf(t, sizeof(t), "%.1f hours",
                    float(dataRefs.ADSBExRReset) / (      60.0f*60.0f));
        else                                            // less than 2 hours
            snprintf(t, sizeof(t), "%.1f minutes",
                    float(dataRefs.ADSBExRReset) / (            60.0f));
        s += t;
    }
    return s;
}